

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateTag(HtmlparserCppTest *this,string *expected_tag)

{
  bool bVar1;
  char *pcVar2;
  
  pcVar2 = HtmlParser::tag(&this->parser_);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "parser_.tag() != __null";
  }
  else {
    pcVar2 = HtmlParser::tag(&this->parser_);
    bVar1 = std::operator==(expected_tag,pcVar2);
    if (bVar1) {
      return;
    }
    pcVar2 = "expected_tag == parser_.tag()";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar2);
  exit(1);
}

Assistant:

void HtmlparserCppTest::ValidateTag(const string &expected_tag) {
  EXPECT_TRUE(parser_.tag() != NULL);
  EXPECT_TRUE(expected_tag == parser_.tag())
      << "Unexpected attr tag name at line " << parser_.line_number();
}